

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void anon_unknown.dwarf_678911::createImplicitNets
               (HierarchicalInstanceSyntax *instance,ASTContext *context,NetType *netType,
               bitmask<slang::ast::InstanceFlags> flags,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *implicitNetNames,SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  undefined1 *this;
  pointer ppIVar1;
  char *pcVar2;
  SyntaxKind SVar3;
  size_t sVar4;
  SyntaxNode *expr;
  Compilation *compilation;
  IdentifierNameSyntax *syntax;
  long lVar5;
  int iVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  byte bVar10;
  bool bVar11;
  byte bVar12;
  uint uVar13;
  PortConnectionSyntax *pPVar14;
  uint64_t hash;
  long lVar15;
  pointer ppIVar16;
  ASTContext *context_00;
  ulong uVar17;
  ulong uVar18;
  ulong pos0;
  undefined1 auVar19 [16];
  undefined1 local_148 [16];
  const_iterator __begin1;
  undefined1 local_e0 [24];
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNets;
  ASTContext ctx;
  
  if (netType->netKind != Unknown) {
    ctx.assertionInstance = context->assertionInstance;
    ctx.scope.ptr = (context->scope).ptr;
    ctx.lookupIndex = context->lookupIndex;
    ctx._12_4_ = *(undefined4 *)&context->field_0xc;
    ctx.flags.m_bits._0_1_ = (undefined1)(context->flags).m_bits;
    ctx.flags.m_bits._1_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 1);
    ctx.flags.m_bits._2_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 2);
    ctx.flags.m_bits._3_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 3);
    ctx.flags.m_bits._4_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 4);
    ctx.flags.m_bits._5_1_ = *(byte *)((long)&(context->flags).m_bits + 5);
    ctx.flags.m_bits._6_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 6);
    ctx.flags.m_bits._7_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 7);
    ctx.instanceOrProc._0_1_ = *(undefined1 *)&context->instanceOrProc;
    ctx.instanceOrProc._1_1_ = *(undefined1 *)((long)&context->instanceOrProc + 1);
    ctx.instanceOrProc._2_1_ = *(undefined1 *)((long)&context->instanceOrProc + 2);
    ctx.instanceOrProc._3_1_ = *(undefined1 *)((long)&context->instanceOrProc + 3);
    ctx.instanceOrProc._4_1_ = *(undefined1 *)((long)&context->instanceOrProc + 4);
    ctx.instanceOrProc._5_1_ = *(undefined1 *)((long)&context->instanceOrProc + 5);
    ctx.instanceOrProc._6_1_ = *(undefined1 *)((long)&context->instanceOrProc + 6);
    ctx.instanceOrProc._7_1_ = *(undefined1 *)((long)&context->instanceOrProc + 7);
    ctx.firstTempVar = context->firstTempVar;
    ctx.randomizeDetails = context->randomizeDetails;
    if ((flags.m_bits & 2) != 0) {
      ctx.flags.m_bits._5_1_ = ctx.flags.m_bits._5_1_ | 0x10;
    }
    __begin1.index = 0;
    sVar4 = (instance->connections).elements._M_extent._M_extent_value;
    this = &(implicitNetNames->super_Storage).field_0x88;
    __begin1.list = &instance->connections;
    for (; (__begin1.list != &instance->connections || (__begin1.index != sVar4 + 1 >> 1));
        __begin1.index = __begin1.index + 1) {
      pPVar14 = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::
                iterator_base<const_slang::syntax::PortConnectionSyntax_*>::dereference(&__begin1);
      SVar3 = (pPVar14->super_SyntaxNode).kind;
      lVar15 = 0x50;
      if (SVar3 == OrderedPortConnection) {
LAB_00219af1:
        expr = *(SyntaxNode **)((long)&(pPVar14->super_SyntaxNode).kind + lVar15);
        if (expr != (SyntaxNode *)0x0) {
          implicitNets.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.data_ =
               (pointer)implicitNets.
                        super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.
                        firstElement;
          implicitNets.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.len = 0;
          implicitNets.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.cap = 5;
          context_00 = &ctx;
          slang::ast::Expression::findPotentiallyImplicitNets
                    (expr,context_00,
                     &implicitNets.
                      super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>);
          compilation = (ctx.scope.ptr)->compilation;
          ppIVar1 = implicitNets.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.
                    data_ + implicitNets.
                            super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.len;
          for (ppIVar16 = implicitNets.
                          super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.data_;
              ppIVar16 != ppIVar1; ppIVar16 = ppIVar16 + 1) {
            syntax = *ppIVar16;
            local_148 = (undefined1  [16])slang::parsing::Token::valueText(&syntax->identifier);
            hash = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                   operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              this,(basic_string_view<char,_std::char_traits<char>_> *)local_148);
            pos0 = hash >> (implicitNetNames->field_0x90 & 0x3f);
            lVar15 = (hash & 0xff) * 4;
            cVar7 = (&UNK_0042856c)[lVar15];
            cVar8 = (&UNK_0042856d)[lVar15];
            cVar9 = (&UNK_0042856e)[lVar15];
            bVar10 = (&UNK_0042856f)[lVar15];
            uVar17 = 0;
            uVar18 = pos0;
            do {
              lVar15 = *(long *)&implicitNetNames->field_0xa0;
              pcVar2 = (char *)(lVar15 + uVar18 * 0x10);
              bVar12 = pcVar2[0xf];
              auVar19[0] = -(*pcVar2 == cVar7);
              auVar19[1] = -(pcVar2[1] == cVar8);
              auVar19[2] = -(pcVar2[2] == cVar9);
              auVar19[3] = -(pcVar2[3] == bVar10);
              auVar19[4] = -(pcVar2[4] == cVar7);
              auVar19[5] = -(pcVar2[5] == cVar8);
              auVar19[6] = -(pcVar2[6] == cVar9);
              auVar19[7] = -(pcVar2[7] == bVar10);
              auVar19[8] = -(pcVar2[8] == cVar7);
              auVar19[9] = -(pcVar2[9] == cVar8);
              auVar19[10] = -(pcVar2[10] == cVar9);
              auVar19[0xb] = -(pcVar2[0xb] == bVar10);
              auVar19[0xc] = -(pcVar2[0xc] == cVar7);
              auVar19[0xd] = -(pcVar2[0xd] == cVar8);
              auVar19[0xe] = -(pcVar2[0xe] == cVar9);
              auVar19[0xf] = -(bVar12 == bVar10);
              uVar13 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
              if (uVar13 != 0) {
                lVar5 = *(long *)&implicitNetNames->field_0xa8;
                do {
                  iVar6 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
                    }
                  }
                  context_00 = (ASTContext *)local_148;
                  bVar11 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                           operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       *)this,(basic_string_view<char,_std::char_traits<char>_> *)
                                              context_00,
                                      (basic_string_view<char,_std::char_traits<char>_> *)
                                      ((ulong)(uint)(iVar6 << 4) + lVar5 + uVar18 * 0xf0));
                  if (bVar11) goto LAB_00219d1a;
                  uVar13 = uVar13 - 1 & uVar13;
                } while (uVar13 != 0);
                bVar12 = *(byte *)(lVar15 + uVar18 * 0x10 + 0xf);
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar12) == 0) break;
              lVar15 = uVar18 + uVar17;
              uVar17 = uVar17 + 1;
              uVar18 = lVar15 + 1U & *(ulong *)&implicitNetNames->field_0x98;
            } while (uVar17 <= *(ulong *)&implicitNetNames->field_0x98);
            if (*(ulong *)&implicitNetNames->field_0xb8 < *(ulong *)&implicitNetNames->field_0xb0) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
              ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                        ((locator *)local_e0,
                         (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                          *)this,pos0,hash,
                         (basic_string_view<char,_std::char_traits<char>_> *)local_148);
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
              ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                        ((locator *)local_e0,
                         (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                          *)this,hash,(basic_string_view<char,_std::char_traits<char>_> *)local_148)
              ;
            }
            local_e0._0_8_ = slang::ast::NetSymbol::createImplicit(compilation,syntax,netType);
            context_00 = (ASTContext *)local_e0;
            slang::SmallVectorBase<slang::ast::Symbol_const*>::
            emplace_back<slang::ast::Symbol_const*>
                      ((SmallVectorBase<slang::ast::Symbol_const*> *)results,(Symbol **)context_00);
LAB_00219d1a:
          }
          slang::SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>::cleanup
                    (&implicitNets.
                      super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>,
                     (EVP_PKEY_CTX *)context_00);
        }
      }
      else if (SVar3 == NamedPortConnection) {
        lVar15 = 0x80;
        goto LAB_00219af1;
      }
    }
  }
  return;
}

Assistant:

void createImplicitNets(const HierarchicalInstanceSyntax& instance, const ASTContext& context,
                        const NetType& netType, bitmask<InstanceFlags> flags,
                        SmallSet<std::string_view, 8>& implicitNetNames,
                        SmallVectorBase<const Symbol*>& results) {
    // If no default nettype is set, we don't create implicit nets.
    if (netType.isError())
        return;

    ASTContext ctx = context;
    if (flags.has(InstanceFlags::FromBind))
        ctx.flags |= ASTFlags::BindInstantiation;

    for (auto conn : instance.connections) {
        const PropertyExprSyntax* expr = nullptr;
        switch (conn->kind) {
            case SyntaxKind::OrderedPortConnection:
                expr = conn->as<OrderedPortConnectionSyntax>().expr;
                break;
            case SyntaxKind::NamedPortConnection:
                expr = conn->as<NamedPortConnectionSyntax>().expr;
                break;
            default:
                break;
        }

        if (!expr)
            continue;

        SmallVector<const IdentifierNameSyntax*> implicitNets;
        Expression::findPotentiallyImplicitNets(*expr, ctx, implicitNets);

        auto& comp = ctx.getCompilation();
        for (auto ins : implicitNets) {
            if (implicitNetNames.emplace(ins->identifier.valueText()).second)
                results.push_back(&NetSymbol::createImplicit(comp, *ins, netType));
        }
    }
}